

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

leveldb * __thiscall leveldb::EscapeString_abi_cxx11_(leveldb *this,Slice *value)

{
  Slice *value_local;
  string *r;
  
  std::__cxx11::string::string((string *)this);
  AppendEscapedStringTo((string *)this,value);
  return this;
}

Assistant:

std::string EscapeString(const Slice& value) {
  std::string r;
  AppendEscapedStringTo(&r, value);
  return r;
}